

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int ecp_randomize_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *pt,
                     _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *X;
  int iVar1;
  int iVar2;
  undefined1 local_40 [8];
  mbedtls_mpi l;
  
  mbedtls_mpi_init((mbedtls_mpi *)local_40);
  iVar1 = mbedtls_mpi_random((mbedtls_mpi *)local_40,2,&grp->P,f_rng,p_rng);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_mul_mod(grp,&pt->Z,&pt->Z,(mbedtls_mpi *)local_40);
    if (iVar1 == 0) {
      X = &pt->Y;
      iVar1 = mbedtls_mpi_mul_mod(grp,X,X,(mbedtls_mpi *)local_40);
      if (iVar1 == 0) {
        iVar1 = mbedtls_mpi_mul_mod(grp,(mbedtls_mpi *)local_40,(mbedtls_mpi *)local_40,
                                    (mbedtls_mpi *)local_40);
        if (iVar1 == 0) {
          iVar1 = mbedtls_mpi_mul_mod(grp,&pt->X,&pt->X,(mbedtls_mpi *)local_40);
          if (iVar1 == 0) {
            iVar1 = mbedtls_mpi_mul_mod(grp,X,X,(mbedtls_mpi *)local_40);
          }
        }
      }
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_40);
  iVar2 = -0x4d00;
  if (iVar1 != -0xe) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

static int ecp_randomize_jac(const mbedtls_ecp_group *grp, mbedtls_ecp_point *pt,
                             int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
#if defined(MBEDTLS_ECP_RANDOMIZE_JAC_ALT)
    if (mbedtls_internal_ecp_grp_capable(grp)) {
        return mbedtls_internal_ecp_randomize_jac(grp, pt, f_rng, p_rng);
    }
#endif /* MBEDTLS_ECP_RANDOMIZE_JAC_ALT */

#if defined(MBEDTLS_ECP_NO_FALLBACK) && defined(MBEDTLS_ECP_RANDOMIZE_JAC_ALT)
    return MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE;
#else
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi l;

    mbedtls_mpi_init(&l);

    /* Generate l such that 1 < l < p */
    MPI_ECP_RAND(&l);

    /* Z' = l * Z */
    MPI_ECP_MUL(&pt->Z,   &pt->Z,     &l);

    /* Y' = l * Y */
    MPI_ECP_MUL(&pt->Y,   &pt->Y,     &l);

    /* X' = l^2 * X */
    MPI_ECP_SQR(&l,       &l);
    MPI_ECP_MUL(&pt->X,   &pt->X,     &l);

    /* Y'' = l^2 * Y' = l^3 * Y */
    MPI_ECP_MUL(&pt->Y,   &pt->Y,     &l);

cleanup:
    mbedtls_mpi_free(&l);

    if (ret == MBEDTLS_ERR_MPI_NOT_ACCEPTABLE) {
        ret = MBEDTLS_ERR_ECP_RANDOM_FAILED;
    }
    return ret;
#endif /* !defined(MBEDTLS_ECP_NO_FALLBACK) || !defined(MBEDTLS_ECP_RANDOMIZE_JAC_ALT) */
}